

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::setupNonLayeredFramebuffer
          (TextureCubeMapArrayStencilAttachments *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6b8))(0x8ca9,0x8ce0,this->m_texture_cube_array_color_id,0,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error attaching texture layer 0 to GL_COLOR_ATTACHMENT0!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x381);
  (**(code **)(lVar3 + 0x6b8))(0x8ca9,0x821a,this->m_texture_cube_array_stencil_id,0,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error attaching texture layer 0 to GL_DEPTH_STENCIL_ATTACHMENT! ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x385);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::setupNonLayeredFramebuffer()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_texture_cube_array_color_id, 0 /* level */,
							   0 /* layer */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture layer 0 to GL_COLOR_ATTACHMENT0!");

	gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, m_texture_cube_array_stencil_id,
							   0 /* level */, 0 /* layer */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture layer 0 to GL_DEPTH_STENCIL_ATTACHMENT! ");
}